

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O1

void gen_stxvh8x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *pTVar1;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  uintptr_t o_5;
  TCGv_i64 pTVar6;
  uintptr_t o_6;
  TCGv_i64 val;
  
  if (ctx->vsx_enabled == false) {
    gen_exception(ctx,0x5e);
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b28))
  ;
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)((ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5) * 0x10 + 0x12b20))
  ;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    pTVar1 = ctx->uc->tcg_ctx;
    tcg_gen_op2_ppc64(pTVar1,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar1),0x20);
    ctx->access_type = 0x20;
  }
  pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar5 - (long)s);
  pTVar1 = ctx->uc->tcg_ctx;
  uVar2 = ctx->opcode >> 0x10 & 0x1f;
  pTVar6 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar2 == 0) {
    if (ctx->sf_mode != false) {
      if (pTVar6 != ret) {
        tcg_gen_op2_ppc64(pTVar1,INDEX_op_mov_i64,(TCGArg)((long)pTVar1 + (long)ret),
                          (TCGArg)(pTVar6 + (long)pTVar1));
      }
      goto LAB_00bc593e;
    }
  }
  else {
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_add_i64,(TCGArg)((long)pTVar1 + (long)ret),
                      (TCGArg)((long)&pTVar1->pool_cur + (long)cpu_gpr[uVar2]),
                      (TCGArg)(pTVar6 + (long)pTVar1));
    pTVar6 = ret;
    if (ctx->sf_mode != false) goto LAB_00bc593e;
  }
  tcg_gen_ext32u_i64_ppc64(pTVar1,ret,pTVar6);
LAB_00bc593e:
  pTVar6 = (TCGv_i64)((long)pTVar3 - (long)s);
  val = (TCGv_i64)((long)pTVar4 - (long)s);
  if (ctx->le_mode == true) {
    pTVar3 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    gen_bswap16x8(s,(TCGv_i64)((long)pTVar3 - (long)s),(TCGv_i64)((long)pTVar4 - (long)s),pTVar6,val
                 );
    tcg_gen_qemu_st_i64_ppc64(s,(TCGv_i64)((long)pTVar3 - (long)s),ret,(long)ctx->mem_idx,MO_BEQ);
    tcg_gen_addi_i64_ppc64(s,ret,ret,8);
    tcg_gen_qemu_st_i64_ppc64(s,(TCGv_i64)((long)pTVar4 - (long)s),ret,(long)ctx->mem_idx,MO_BEQ);
    tcg_temp_free_internal_ppc64(s,pTVar3);
    tcg_temp_free_internal_ppc64(s,pTVar4);
  }
  else {
    tcg_gen_qemu_st_i64_ppc64(s,pTVar6,ret,(long)ctx->mem_idx,MO_BEQ);
    tcg_gen_addi_i64_ppc64(s,ret,ret,8);
    tcg_gen_qemu_st_i64_ppc64(s,val,ret,(long)ctx->mem_idx,MO_BEQ);
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar6 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(val + (long)s));
  return;
}

Assistant:

static void gen_stxvh8x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 xsh;
    TCGv_i64 xsl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xsh = tcg_temp_new_i64(tcg_ctx);
    xsl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xsh, xS(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xsl, xS(ctx->opcode));
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    if (ctx->le_mode) {
        TCGv_i64 outh = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 outl = tcg_temp_new_i64(tcg_ctx);

        gen_bswap16x8(tcg_ctx, outh, outl, xsh, xsl);
        tcg_gen_qemu_st_i64(tcg_ctx, outh, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_st_i64(tcg_ctx, outl, EA, ctx->mem_idx, MO_BEQ);
        tcg_temp_free_i64(tcg_ctx, outh);
        tcg_temp_free_i64(tcg_ctx, outl);
    } else {
        tcg_gen_qemu_st_i64(tcg_ctx, xsh, EA, ctx->mem_idx, MO_BEQ);
        tcg_gen_addi_tl(tcg_ctx, EA, EA, 8);
        tcg_gen_qemu_st_i64(tcg_ctx, xsl, EA, ctx->mem_idx, MO_BEQ);
    }
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, xsh);
    tcg_temp_free_i64(tcg_ctx, xsl);
}